

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O1

int nn_xreq_add(nn_sockbase *self,nn_pipe *pipe)

{
  int increment;
  int extraout_EAX;
  nn_lb_data *pnVar1;
  nn_pipe *self_00;
  nn_sockbase *self_01;
  int rcvprio;
  int sndprio;
  size_t sz;
  int local_28;
  int local_24;
  size_t local_20;
  
  local_20 = 4;
  self_00 = (nn_pipe *)0x0;
  self_01 = (nn_sockbase *)pipe;
  nn_pipe_getopt(pipe,0,8,&local_24,&local_20);
  if (local_20 == 4) {
    if (local_24 - 0x11U < 0xfffffff0) goto LAB_00127753;
    local_20 = 4;
    self_00 = (nn_pipe *)0x0;
    self_01 = (nn_sockbase *)pipe;
    nn_pipe_getopt(pipe,0,9,&local_28,&local_20);
    if (local_20 != 4) goto LAB_00127758;
    if (0xffffffef < local_28 - 0x11U) {
      self_01 = (nn_sockbase *)0x40;
      pnVar1 = (nn_lb_data *)nn_alloc_(0x40);
      if (pnVar1 != (nn_lb_data *)0x0) {
        nn_pipe_setdata(pipe,pnVar1);
        nn_lb_add((nn_lb *)(self + 1),pnVar1,pipe,local_24);
        nn_fq_add((nn_fq *)&self[0x19].sock,(nn_fq_data *)(pnVar1 + 1),pipe,local_28);
        return 0;
      }
      goto LAB_00127762;
    }
  }
  else {
    nn_xreq_add_cold_1();
LAB_00127753:
    nn_xreq_add_cold_5();
LAB_00127758:
    nn_xreq_add_cold_2();
  }
  nn_xreq_add_cold_4();
LAB_00127762:
  nn_xreq_add_cold_3();
  pnVar1 = (nn_lb_data *)nn_pipe_getdata(self_00);
  nn_lb_rm((nn_lb *)(self_01 + 1),pnVar1);
  nn_fq_rm((nn_fq *)&self_01[0x19].sock,(nn_fq_data *)(pnVar1 + 1));
  nn_free(pnVar1);
  increment = nn_lb_get_priority((nn_lb *)(self_01 + 1));
  nn_sockbase_stat_increment(self_01,0x191,increment);
  return extraout_EAX;
}

Assistant:

int nn_xreq_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xreq *xreq;
    struct nn_xreq_data *data;
    int sndprio;
    int rcvprio;
    size_t sz;

    xreq = nn_cont (self, struct nn_xreq, sockbase);

    sz = sizeof (sndprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_SNDPRIO, &sndprio, &sz);
    nn_assert (sz == sizeof (sndprio));
    nn_assert (sndprio >= 1 && sndprio <= 16);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xreq_data), "pipe data (req)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_lb_add (&xreq->lb, &data->lb, pipe, sndprio);
    nn_fq_add (&xreq->fq, &data->fq, pipe, rcvprio);

    return 0;
}